

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O2

void GPU_MatrixTranslate(float *result,float x,float y,float z)

{
  float local_48 [13];
  float local_14;
  float local_10;
  undefined4 local_c;
  
  if (result != (float *)0x0) {
    local_48[0] = 1.0;
    local_48[1] = 0.0;
    local_48[2] = 0.0;
    local_48[3] = 0.0;
    local_48[4] = 0.0;
    local_48[5] = 1.0;
    local_48[6] = 0.0;
    local_48[7] = 0.0;
    local_48[8] = 0.0;
    local_48[9] = 0.0;
    local_48[10] = 1.0;
    local_48[0xb] = 0.0;
    local_c = 0x3f800000;
    local_48[0xc] = x;
    local_14 = y;
    local_10 = z;
    GPU_MultiplyAndAssign(result,local_48);
  }
  return;
}

Assistant:

void GPU_MatrixTranslate(float* result, float x, float y, float z)
{
    if(result == NULL)
		return;

	{
#ifdef ROW_MAJOR
		float A[16];
		FILL_MATRIX_4x4(A,
				1, 0, 0, x,
				0, 1, 0, y,
				0, 0, 1, z,
				0, 0, 0, 1
			);
#else
		float A[16];
		FILL_MATRIX_4x4(A,
				1, 0, 0, 0,
				0, 1, 0, 0,
				0, 0, 1, 0,
				x, y, z, 1
			);
#endif

		GPU_MultiplyAndAssign(result, A);
	}
}